

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

c_float * vec_copy(c_float *a,c_int n)

{
  long in_RSI;
  long in_RDI;
  c_int i;
  c_float *b;
  long local_28;
  c_float *local_8;
  
  local_8 = (c_float *)malloc(in_RSI << 3);
  if (local_8 == (c_float *)0x0) {
    local_8 = (c_float *)0x0;
  }
  else {
    for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
      local_8[local_28] = *(c_float *)(in_RDI + local_28 * 8);
    }
  }
  return local_8;
}

Assistant:

c_float* vec_copy(c_float *a, c_int n) {
  c_float *b;
  c_int    i;

  b = c_malloc(n * sizeof(c_float));
  if (!b) return OSQP_NULL;

  for (i = 0; i < n; i++) {
    b[i] = a[i];
  }

  return b;
}